

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureCompressedFormatTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::texture::anon_unknown_1::Compressed2DTestInstance::iterate
          (TestStatus *__return_storage_ptr__,Compressed2DTestInstance *this)

{
  TextureRenderer *this_00;
  ostringstream *this_01;
  TextureFormat TVar1;
  ParameterType *pPVar2;
  TestStatus *pTVar3;
  bool bVar4;
  int iVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  TestTexture2D *pTVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  vector<float,_std::allocator<float>_> texCoord;
  Surface referenceFrame;
  Surface rendered;
  IVec4 formatBitDepth;
  TextureFormat textureFormat;
  TextureFormatInfo formatInfo;
  PixelFormat local_318;
  vector<float,_std::allocator<float>_> local_308;
  TestStatus *local_2f0;
  Surface local_2e8;
  Surface local_2d0;
  PixelFormat local_2b8;
  TextureFormat local_2a0;
  undefined1 local_294 [76];
  long lStack_248;
  long local_240;
  undefined8 uStack_238;
  int local_230;
  anon_union_16_3_1194ccdc_for_v local_22c;
  undefined8 local_21c;
  LodMode local_214;
  undefined1 local_200 [120];
  ios_base local_188 [264];
  Texture2DView local_80;
  TextureFormatInfo local_70;
  
  TVar1 = (TextureFormat)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  this_00 = &this->m_renderer;
  local_2f0 = __return_storage_ptr__;
  pTVar8 = util::TextureRenderer::get2DTexture(this_00,0);
  iVar5 = (*(pTVar8->super_TestTexture)._vptr_TestTexture[0xe])(pTVar8);
  local_2a0 = *(TextureFormat *)CONCAT44(extraout_var,iVar5);
  tcu::getTextureFormatInfo(&local_70,&local_2a0);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_294,TEXTURETYPE_2D);
  dVar6 = util::TextureRenderer::getRenderWidth(this_00);
  dVar7 = util::TextureRenderer::getRenderHeight(this_00);
  tcu::Surface::Surface(&local_2d0,dVar6,dVar7);
  local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pPVar2 = this->m_testParameters;
  util::createSampler((Sampler *)local_200,
                      (pPVar2->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.wrapS,
                      (pPVar2->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.wrapT,
                      (pPVar2->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.minFilter,
                      (pPVar2->super_Texture2DTestCaseParameters).
                      super_TextureCommonTestCaseParameters.magFilter);
  this_01 = (ostringstream *)(local_200 + 8);
  local_230 = local_200._32_4_;
  local_240 = local_200._16_8_;
  uStack_238 = local_200._24_8_;
  local_294._68_8_ = local_200._0_8_;
  lStack_248 = local_200._8_8_;
  local_22c._0_8_ = local_200._36_8_;
  local_22c._8_8_ = local_200._44_8_;
  local_21c = local_200._52_8_;
  local_294._4_4_ = SAMPLERTYPE_FLOAT;
  local_214 = LODMODE_EXACT;
  local_294._52_4_ = local_70.lookupBias.m_data[0];
  local_294._56_4_ = local_70.lookupBias.m_data[1];
  local_294._60_4_ = local_70.lookupBias.m_data[2];
  local_294._64_4_ = local_70.lookupBias.m_data[3];
  local_294._36_4_ = local_70.lookupScale.m_data[0];
  local_294._40_4_ = local_70.lookupScale.m_data[1];
  local_294._44_4_ = local_70.lookupScale.m_data[2];
  local_294._48_4_ = local_70.lookupScale.m_data[3];
  local_200._0_8_ = TVar1;
  std::__cxx11::ostringstream::ostringstream(this_01);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,"Compare reference value = ",0x1a);
  std::ostream::_M_insert<double>((double)(float)local_294._32_4_);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_200,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_01);
  std::ios_base::~ios_base(local_188);
  local_200._0_4_ = R;
  local_200._4_4_ = SNORM_INT8;
  local_2e8.m_width = 0x3f800000;
  local_2e8.m_height = 0x3f800000;
  glu::TextureTestUtil::computeQuadTexCoord2D(&local_308,(Vec2 *)local_200,(Vec2 *)&local_2e8);
  util::TextureRenderer::renderQuad
            (this_00,&local_2d0,0,
             local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,(ReferenceParams *)local_294);
  local_200._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)&local_2b8,(TextureFormat *)local_200);
  local_318.redBits = local_2b8.redBits;
  local_318.greenBits = local_2b8.greenBits;
  local_318.blueBits = local_2b8.blueBits;
  local_318.alphaBits = local_2b8.alphaBits;
  dVar6 = util::TextureRenderer::getRenderWidth(this_00);
  dVar7 = util::TextureRenderer::getRenderHeight(this_00);
  tcu::Surface::Surface(&local_2e8,dVar6,dVar7);
  tcu::SurfaceAccess::SurfaceAccess((SurfaceAccess *)local_200,&local_2e8,&local_318);
  iVar5 = (*(((this->m_texture).m_ptr)->super_TestTexture)._vptr_TestTexture[0x11])();
  local_80.m_numLevels = *(int *)(CONCAT44(extraout_var_00,iVar5) + 0x40);
  local_80.m_levels = *(ConstPixelBufferAccess **)(CONCAT44(extraout_var_00,iVar5) + 0x48);
  glu::TextureTestUtil::sampleTexture
            ((SurfaceAccess *)local_200,&local_80,
             local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,(ReferenceParams *)local_294);
  uVar11 = 0;
  if (0 < local_318.alphaBits) {
    uVar11 = 0x1000000 << (8U - (char)local_318.alphaBits & 0x1f);
  }
  uVar10 = 0x100 << (8U - (char)local_318.greenBits & 0x1f) |
           1 << ((byte)(8U - (char)local_318.redBits) & 0x1f);
  uVar11 = 0x10000 << (8U - (char)local_318.blueBits & 0x1f) | uVar10 | uVar11;
  uVar9 = 1 << (8U - (char)local_318.redBits & 0x1f) & 0xff;
  if (0xfd < uVar9) {
    uVar9 = 0xfe;
  }
  uVar10 = uVar10 >> 8 & 0xff;
  if (0xfd < uVar10) {
    uVar10 = 0xfe;
  }
  uVar12 = uVar11 >> 0x10 & 0xff;
  if (0xfd < uVar12) {
    uVar12 = 0xfe;
  }
  uVar11 = uVar11 >> 0x18;
  if (0xfd < uVar11) {
    uVar11 = 0xfe;
  }
  bVar4 = glu::TextureTestUtil::compareImages
                    ((TestLog *)TVar1,&local_2e8,&local_2d0,
                     (RGBA)(uVar11 * 0x1000000 + (uVar12 << 0x10 | uVar10 << 8 | uVar9) + 0x1010101)
                    );
  pTVar3 = local_2f0;
  TVar1 = (TextureFormat)((long)local_200 + 0x10);
  local_200._0_8_ = TVar1;
  if (bVar4) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"Pass","");
    pTVar3->m_code = QP_TEST_RESULT_PASS;
    (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar3->m_description,local_200._0_8_,
               (undefined1 *)(local_200._8_8_ + local_200._0_8_));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_200,"Image verification failed","");
    pTVar3->m_code = QP_TEST_RESULT_FAIL;
    (pTVar3->m_description)._M_dataplus._M_p = (pointer)&(pTVar3->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar3->m_description,local_200._0_8_,
               (undefined1 *)(local_200._8_8_ + local_200._0_8_));
  }
  if ((TextureFormat)local_200._0_8_ != TVar1) {
    operator_delete((void *)local_200._0_8_,local_200._16_8_ + 1);
  }
  tcu::Surface::~Surface(&local_2e8);
  if (local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_308.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&local_2d0);
  return pTVar3;
}

Assistant:

tcu::TestStatus Compressed2DTestInstance::iterate (void)
{
	tcu::TestLog&					log				= m_context.getTestContext().getLog();
	const pipeline::TestTexture2D&	texture			= m_renderer.get2DTexture(0);
	const tcu::TextureFormat		textureFormat	= texture.getTextureFormat();
	const tcu::TextureFormatInfo	formatInfo		= tcu::getTextureFormatInfo(textureFormat);

	ReferenceParams					sampleParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered		(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	vector<float>					texCoord;

	// Setup params for reference.
	sampleParams.sampler			= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	sampleParams.samplerType		= SAMPLERTYPE_FLOAT;
	sampleParams.lodMode			= LODMODE_EXACT;
	sampleParams.colorBias			= formatInfo.lookupBias;
	sampleParams.colorScale			= formatInfo.lookupScale;

	log << TestLog::Message << "Compare reference value = " << sampleParams.ref << TestLog::EndMessage;

	// Compute texture coordinates.
	computeQuadTexCoord2D(texCoord, tcu::Vec2(0.0f, 0.0f), tcu::Vec2(1.0f, 1.0f));

	m_renderer.renderQuad(rendered, 0, &texCoord[0], sampleParams);

	// Compute reference.
	const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
	const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
	tcu::Surface			referenceFrame	(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
	sampleTexture(tcu::SurfaceAccess(referenceFrame, pixelFormat), m_texture->getTexture(), &texCoord[0], sampleParams);

	// Compare and log.
	const bool isOk = compareImages(log, referenceFrame, rendered, pixelFormat.getColorThreshold() + tcu::RGBA(1, 1, 1, 1));

	return isOk ? tcu::TestStatus::pass("Pass") : tcu::TestStatus::fail("Image verification failed");
}